

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O0

optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> * __thiscall
wasm::WATParser::anon_unknown_10::num
          (optional<wasm::WATParser::(anonymous_namespace)::LexIntResult> *__return_storage_ptr__,
          anon_unknown_10 *this,string_view in,OverflowBehavior overflow)

{
  string_view in_00;
  bool bVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> sv;
  bool under;
  undefined1 local_48 [8];
  LexIntCtx ctx;
  OverflowBehavior overflow_local;
  string_view in_local;
  
  ctx._36_4_ = in._M_str._0_4_;
  in_00._M_str = (char *)in._M_len;
  in_00._M_len = (size_t)this;
  LexIntCtx::LexIntCtx((LexIntCtx *)local_48,in_00);
  bVar1 = LexCtx::empty((LexCtx *)local_48);
  if (bVar1) {
    std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::optional
              (__return_storage_ptr__);
  }
  else {
    bVar1 = LexIntCtx::takeDigit((LexIntCtx *)local_48);
    if (bVar1) {
      do {
        sv = ::sv("_",1);
        bVar1 = LexCtx::takePrefix((LexCtx *)local_48,sv);
        bVar2 = LexIntCtx::takeDigit((LexIntCtx *)local_48);
      } while (bVar2);
      if (bVar1) {
        std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::optional
                  (__return_storage_ptr__);
      }
      else if (ctx._36_4_ == 0) {
        LexIntCtx::lexed(__return_storage_ptr__,(LexIntCtx *)local_48);
      }
      else {
        LexIntCtx::lexedRaw(__return_storage_ptr__,(LexIntCtx *)local_48);
      }
    }
    else {
      std::optional<wasm::WATParser::(anonymous_namespace)::LexIntResult>::optional
                (__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<LexIntResult> num(std::string_view in,
                                OverflowBehavior overflow = DisallowOverflow) {
  LexIntCtx ctx(in);
  if (ctx.empty()) {
    return {};
  }
  if (!ctx.takeDigit()) {
    return {};
  }
  while (true) {
    bool under = ctx.takePrefix("_"sv);
    if (!ctx.takeDigit()) {
      if (!under) {
        return overflow == DisallowOverflow ? ctx.lexed() : ctx.lexedRaw();
      }
      // TODO: Add error production for trailing underscore.
      return {};
    }
  }
}